

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int apply_stream_frame(quicly_stream_t *stream,quicly_stream_frame_t *frame)

{
  uint64_t *puVar1;
  size_t sVar2;
  uint64_t off;
  quicly_conn_t *pqVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t apply_len;
  size_t local_20;
  
  sVar2 = (stream->recvstate).received.num_ranges;
  if (sVar2 == 0) {
    iVar4 = 0;
  }
  else {
    off = frame->offset;
    local_20 = (frame->data).len;
    uVar7 = local_20 + off;
    if (stream->stream_id < 0) {
      if (((stream->conn->super).ctx)->max_crypto_bytes < uVar7) {
        return 0x2000d;
      }
    }
    else {
      if ((long)(ulong)(stream->_recv_aux).window < (long)(uVar7 - (stream->recvstate).data_off)) {
        return 0x20003;
      }
      puVar1 = &(stream->recvstate).received.ranges[sVar2 - 1].end;
      lVar6 = uVar7 - *puVar1;
      if (*puVar1 <= uVar7 && lVar6 != 0) {
        pqVar3 = stream->conn;
        uVar7 = lVar6 + (pqVar3->ingress).max_data.bytes_consumed;
        if ((ulong)(pqVar3->ingress).max_data.sender.max_committed < uVar7) {
          return 0x20003;
        }
        (pqVar3->ingress).max_data.bytes_consumed = uVar7;
      }
    }
    iVar4 = quicly_recvstate_update
                      (&stream->recvstate,off,&local_20,(byte)frame->field_0x8 & 1,
                       (ulong)(stream->_recv_aux).max_ranges);
    if (iVar4 == 0) {
      if (((local_20 != 0) || ((stream->recvstate).received.num_ranges == 0)) &&
         (sVar2 = (frame->data).len,
         (*stream->callbacks->on_receive)
                   (stream,(frame->offset + sVar2) - ((stream->recvstate).data_off + local_20),
                    (frame->data).base + (sVar2 - local_20),local_20),
         QUICLY_STATE_CONNECTED < (stream->conn->super).state)) {
        return 0xff06;
      }
      iVar4 = should_send_max_stream_data(stream);
      if (iVar4 != 0) {
        sched_stream_control(stream);
      }
      iVar5 = stream_is_destroyable(stream);
      iVar4 = 0;
      if (iVar5 != 0) {
        destroy_stream(stream,0);
      }
    }
  }
  return iVar4;
}

Assistant:

static int apply_stream_frame(quicly_stream_t *stream, quicly_stream_frame_t *frame)
{
    int ret;

    QUICLY_PROBE(STREAM_RECEIVE, stream->conn, stream->conn->stash.now, stream, frame->offset, frame->data.len);

    if (quicly_recvstate_transfer_complete(&stream->recvstate))
        return 0;

    /* flow control */
    if (stream->stream_id >= 0) {
        /* STREAMs */
        uint64_t max_stream_data = frame->offset + frame->data.len;
        if ((int64_t)stream->_recv_aux.window < (int64_t)max_stream_data - (int64_t)stream->recvstate.data_off)
            return QUICLY_TRANSPORT_ERROR_FLOW_CONTROL;
        if (stream->recvstate.received.ranges[stream->recvstate.received.num_ranges - 1].end < max_stream_data) {
            uint64_t newly_received =
                max_stream_data - stream->recvstate.received.ranges[stream->recvstate.received.num_ranges - 1].end;
            if (stream->conn->ingress.max_data.bytes_consumed + newly_received >
                stream->conn->ingress.max_data.sender.max_committed)
                return QUICLY_TRANSPORT_ERROR_FLOW_CONTROL;
            stream->conn->ingress.max_data.bytes_consumed += newly_received;
            /* FIXME send MAX_DATA if necessary */
        }
    } else {
        /* CRYPTO streams; maybe add different limit for 1-RTT CRYPTO? */
        if (frame->offset + frame->data.len > stream->conn->super.ctx->max_crypto_bytes)
            return QUICLY_TRANSPORT_ERROR_CRYPTO_BUFFER_EXCEEDED;
    }

    /* update recvbuf */
    size_t apply_len = frame->data.len;
    if ((ret = quicly_recvstate_update(&stream->recvstate, frame->offset, &apply_len, frame->is_fin,
                                       stream->_recv_aux.max_ranges)) != 0)
        return ret;

    if (apply_len != 0 || quicly_recvstate_transfer_complete(&stream->recvstate)) {
        uint64_t buf_offset = frame->offset + frame->data.len - apply_len - stream->recvstate.data_off;
        const void *apply_src = frame->data.base + frame->data.len - apply_len;
        QUICLY_PROBE(STREAM_ON_RECEIVE, stream->conn, stream->conn->stash.now, stream, (size_t)buf_offset, apply_src, apply_len);
        stream->callbacks->on_receive(stream, (size_t)buf_offset, apply_src, apply_len);
        if (stream->conn->super.state >= QUICLY_STATE_CLOSING)
            return QUICLY_ERROR_IS_CLOSING;
    }

    if (should_send_max_stream_data(stream))
        sched_stream_control(stream);

    if (stream_is_destroyable(stream))
        destroy_stream(stream, 0);

    return 0;
}